

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O3

KeyValues * __thiscall KV::KeyValues::get(KeyValues *this,string *name,size_t index)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = (this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 == (_Rb_tree_node_base *)0x0) {
    p_Var1 = &(this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    for (p_Var2 = p_Var1->_M_left; p_Var2 != (_Base_ptr)0x0; p_Var2 = p_Var2->_M_left) {
      p_Var1 = p_Var2;
    }
  }
  if ((long)index < 1) {
    if (index != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var1);
        index = index + 1;
      } while (index != 0);
    }
  }
  else {
    do {
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      index = index - 1;
    } while (index != 0);
  }
  return *(KeyValues **)(p_Var1 + 2);
}

Assistant:

KeyValues &KeyValues::get( const std::string &name, size_t index )
	{
		auto range = keyvalues.equal_range( name );

		auto it = range.first;
		std::advance( it, index );

		return *it->second;
	}